

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrpParser.cpp
# Opt level: O0

void __thiscall GrpParser::languageCodeList(GrpParser *this)

{
  int iVar1;
  undefined8 uVar2;
  long *in_RDI;
  ParserException *ex;
  RefAST tmp177_AST;
  RefAST tmp176_AST;
  RefAST tmp175_AST;
  RefAST tmp174_AST;
  RefAST tmp173_AST;
  RefAST tmp172_AST;
  RefAST languageCodeList_AST;
  ASTPair currentAST;
  ASTPair *in_stack_fffffffffffffe90;
  RefCount<AST> *in_stack_fffffffffffffe98;
  ASTPair *in_stack_fffffffffffffea0;
  RefCount<AST> *this_00;
  RefCount<AST> *in_stack_fffffffffffffea8;
  RefCount<AST> *in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  ASTFactory *in_stack_fffffffffffffec8;
  ASTFactory *pAVar3;
  Parser *in_stack_fffffffffffffed0;
  Parser *this_01;
  ASTPair *in_stack_fffffffffffffed8;
  ASTPair *currentAST_00;
  ASTFactory *in_stack_fffffffffffffee0;
  RefToken *in_stack_ffffffffffffff08;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 uVar4;
  undefined1 local_e8 [16];
  undefined1 local_d8 [32];
  undefined1 local_b8 [24];
  undefined1 local_a0 [32];
  undefined1 local_80 [24];
  undefined1 local_68 [32];
  undefined1 local_48 [72];
  
  RefCount<AST>::operator=(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  ASTPair::ASTPair(in_stack_fffffffffffffea0);
  RefCount<AST>::RefCount(&in_stack_fffffffffffffea0->root,in_stack_fffffffffffffe98);
  iVar1 = (**(code **)(*in_RDI + 0x20))(in_RDI,1);
  if (iVar1 == 6) {
    RefCount<AST>::RefCount(&in_stack_fffffffffffffea0->root,in_stack_fffffffffffffe98);
    currentAST_00 = (ASTPair *)(in_RDI + 6);
    (**(code **)(*in_RDI + 0x28))(local_68,in_RDI,1);
    ASTFactory::create(in_stack_fffffffffffffec8,
                       (RefToken *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
    RefCount<AST>::operator=(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffe90->root);
    RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_fffffffffffffea0);
    Parser::match(in_stack_fffffffffffffed0,(int)((ulong)in_stack_fffffffffffffec8 >> 0x20));
    RefCount<AST>::RefCount(&in_stack_fffffffffffffea0->root,in_stack_fffffffffffffe98);
    this_01 = (Parser *)(in_RDI + 6);
    (**(code **)(*in_RDI + 0x28))(local_80,in_RDI,1);
    ASTFactory::create(in_stack_fffffffffffffec8,
                       (RefToken *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
    RefCount<AST>::operator=(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffe90->root);
    RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_fffffffffffffea0);
    pAVar3 = (ASTFactory *)(in_RDI + 6);
    RefCount<AST>::RefCount(&in_stack_fffffffffffffea0->root,in_stack_fffffffffffffe98);
    ASTFactory::addASTChild(in_stack_fffffffffffffee0,currentAST_00,(RefAST *)this_01);
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffe90->root);
    Parser::match(this_01,(int)((ulong)pAVar3 >> 0x20));
    while (iVar1 = (**(code **)(*in_RDI + 0x20))(in_RDI,1), iVar1 == 0x15) {
      RefCount<AST>::RefCount(&in_stack_fffffffffffffea0->root,in_stack_fffffffffffffe98);
      (**(code **)(*in_RDI + 0x28))(local_a0,in_RDI,1);
      ASTFactory::create(pAVar3,(RefToken *)CONCAT44(iVar1,in_stack_fffffffffffffec0));
      RefCount<AST>::operator=(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
      RefCount<AST>::~RefCount(&in_stack_fffffffffffffe90->root);
      RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_fffffffffffffea0);
      Parser::match(this_01,(int)((ulong)pAVar3 >> 0x20));
      RefCount<AST>::RefCount(&in_stack_fffffffffffffea0->root,in_stack_fffffffffffffe98);
      in_stack_fffffffffffffeb0 = (RefCount<AST> *)(in_RDI + 6);
      (**(code **)(*in_RDI + 0x28))(local_b8,in_RDI,1);
      ASTFactory::create(pAVar3,(RefToken *)CONCAT44(iVar1,in_stack_fffffffffffffec0));
      RefCount<AST>::operator=(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
      RefCount<AST>::~RefCount(&in_stack_fffffffffffffe90->root);
      RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_fffffffffffffea0);
      in_stack_fffffffffffffea8 = (RefCount<AST> *)(in_RDI + 6);
      RefCount<AST>::RefCount(&in_stack_fffffffffffffea0->root,in_stack_fffffffffffffe98);
      ASTFactory::addASTChild(in_stack_fffffffffffffee0,currentAST_00,(RefAST *)this_01);
      RefCount<AST>::~RefCount(&in_stack_fffffffffffffe90->root);
      Parser::match(this_01,(int)((ulong)pAVar3 >> 0x20));
      RefCount<AST>::~RefCount(&in_stack_fffffffffffffe90->root);
      RefCount<AST>::~RefCount(&in_stack_fffffffffffffe90->root);
    }
    RefCount<AST>::RefCount(&in_stack_fffffffffffffea0->root,in_stack_fffffffffffffe98);
    this_00 = (RefCount<AST> *)(in_RDI + 6);
    (**(code **)(*in_RDI + 0x28))(local_d8,in_RDI,1);
    ASTFactory::create(pAVar3,(RefToken *)CONCAT44(iVar1,in_stack_fffffffffffffec0));
    iVar1 = (int)((ulong)pAVar3 >> 0x20);
    RefCount<AST>::operator=(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffe90->root);
    RefCount<Token>::~RefCount((RefCount<Token> *)this_00);
    RefCount<AST>::RefCount(this_00,(RefCount<AST> *)(in_RDI + 6));
    ASTFactory::addASTChild(in_stack_fffffffffffffee0,currentAST_00,(RefAST *)this_01);
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffe90->root);
    Parser::match(this_01,iVar1);
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffe90->root);
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffe90->root);
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffe90->root);
  }
  else {
    if (iVar1 != 0x14) {
      uVar4 = 1;
      uVar2 = __cxa_allocate_exception(0x40);
      (**(code **)(*in_RDI + 0x28))(local_e8,in_RDI,1);
      NoViableAltException::NoViableAltException
                ((NoViableAltException *)CONCAT17(uVar4,in_stack_ffffffffffffff10),
                 in_stack_ffffffffffffff08);
      __cxa_throw(uVar2,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException)
      ;
    }
    RefCount<AST>::RefCount(&in_stack_fffffffffffffea0->root,in_stack_fffffffffffffe98);
    (**(code **)(*in_RDI + 0x28))(local_48,in_RDI,1);
    ASTFactory::create(in_stack_fffffffffffffec8,
                       (RefToken *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
    iVar1 = (int)((ulong)in_stack_fffffffffffffec8 >> 0x20);
    RefCount<AST>::operator=(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffe90->root);
    RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_fffffffffffffea0);
    pAVar3 = (ASTFactory *)(in_RDI + 6);
    RefCount<AST>::RefCount(&in_stack_fffffffffffffea0->root,in_stack_fffffffffffffe98);
    ASTFactory::addASTChild(pAVar3,in_stack_fffffffffffffed8,(RefAST *)in_stack_fffffffffffffed0);
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffe90->root);
    Parser::match(in_stack_fffffffffffffed0,iVar1);
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffe90->root);
  }
  RefCount<AST>::operator=(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  RefCount<AST>::operator=(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffe90->root);
  ASTPair::~ASTPair(in_stack_fffffffffffffe90);
  return;
}

Assistant:

void GrpParser::languageCodeList() {
	
	returnAST = nullAST;
	ASTPair currentAST;
	RefAST languageCodeList_AST = nullAST;
	
	try {      // for error handling
		{
		switch ( LA(1)) {
		case LIT_STRING:
		{
			RefAST tmp172_AST = nullAST;
			tmp172_AST = astFactory.create(LT(1));
			astFactory.addASTChild(currentAST, tmp172_AST);
			match(LIT_STRING);
			break;
		}
		case OP_LPAREN:
		{
			RefAST tmp173_AST = nullAST;
			tmp173_AST = astFactory.create(LT(1));
			match(OP_LPAREN);
			RefAST tmp174_AST = nullAST;
			tmp174_AST = astFactory.create(LT(1));
			astFactory.addASTChild(currentAST, tmp174_AST);
			match(LIT_STRING);
			{
			do {
				if ((LA(1)==OP_COMMA)) {
					RefAST tmp175_AST = nullAST;
					tmp175_AST = astFactory.create(LT(1));
					match(OP_COMMA);
					RefAST tmp176_AST = nullAST;
					tmp176_AST = astFactory.create(LT(1));
					astFactory.addASTChild(currentAST, tmp176_AST);
					match(LIT_STRING);
				}
				else {
					goto _loop182;
				}
				
			} while (true);
			_loop182:;
			}
			RefAST tmp177_AST = nullAST;
			tmp177_AST = astFactory.create(LT(1));
			astFactory.addASTChild(currentAST, tmp177_AST);
			match(OP_RPAREN);
			break;
		}
		default:
		{
			throw NoViableAltException(LT(1));
		}
		}
		}
		languageCodeList_AST = currentAST.root;
	}
	catch (ParserException& ex) {
		reportError(ex);
		consume();
		consumeUntil(_tokenSet_45);
	}
	returnAST = languageCodeList_AST;
}